

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O2

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::epoch_check
          (cache<uint256,_SignatureCacheHasher> *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  __atomic_base<unsigned_char> *p_Var1;
  long lVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t i;
  ulong uVar8;
  long in_FS_OFFSET;
  reference rVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->epoch_heuristic_counter == 0) {
    this_00 = &this->epoch_flags;
    uVar7 = 0;
    for (uVar8 = 0; uVar5 = (ulong)this->size, uVar8 < uVar5; uVar8 = uVar8 + 1) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
      if ((*rVar9._M_p & rVar9._M_mask) == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)(((this->collection_flags).mem._M_t.
                        super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                        .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                        [uVar8 >> 3].super___atomic_base<unsigned_char>._M_i >> ((uint)uVar8 & 7) &
                       1) == 0);
      }
      uVar7 = uVar7 + uVar4;
    }
    uVar4 = this->epoch_size;
    uVar6 = uVar4 - uVar7;
    if (uVar4 < uVar7 || uVar6 == 0) {
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
        if ((*rVar9._M_p & rVar9._M_mask) == 0) {
          LOCK();
          p_Var1 = &(this->collection_flags).mem._M_t.
                    super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                    .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                    [uVar8 >> 3].super___atomic_base<unsigned_char>;
          p_Var1->_M_i = p_Var1->_M_i | '\x01' << ((byte)uVar8 & 7);
          UNLOCK();
        }
        else {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar8);
          *rVar9._M_p = *rVar9._M_p & ~rVar9._M_mask;
        }
        uVar5 = (ulong)this->size;
      }
      uVar3 = this->epoch_size;
    }
    else {
      uVar7 = uVar4 >> 4;
      if (uVar4 >> 4 <= uVar6) {
        uVar7 = uVar6;
      }
      uVar3 = uVar7 + (uVar7 == 0);
    }
  }
  else {
    uVar3 = this->epoch_heuristic_counter - 1;
  }
  this->epoch_heuristic_counter = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void epoch_check()
    {
        if (epoch_heuristic_counter != 0) {
            --epoch_heuristic_counter;
            return;
        }
        // count the number of elements from the latest epoch which
        // have not been erased.
        uint32_t epoch_unused_count = 0;
        for (uint32_t i = 0; i < size; ++i)
            epoch_unused_count += epoch_flags[i] &&
                                  !collection_flags.bit_is_set(i);
        // If there are more non-deleted entries in the current epoch than the
        // epoch size, then allow_erase on all elements in the old epoch (marked
        // false) and move all elements in the current epoch to the old epoch
        // but do not call allow_erase on their indices.
        if (epoch_unused_count >= epoch_size) {
            for (uint32_t i = 0; i < size; ++i)
                if (epoch_flags[i])
                    epoch_flags[i] = false;
                else
                    allow_erase(i);
            epoch_heuristic_counter = epoch_size;
        } else
            // reset the epoch_heuristic_counter to next do a scan when worst
            // case behavior (no intermittent erases) would exceed epoch size,
            // with a reasonable minimum scan size.
            // Ordinarily, we would have to sanity check std::min(epoch_size,
            // epoch_unused_count), but we already know that `epoch_unused_count
            // < epoch_size` in this branch
            epoch_heuristic_counter = std::max(1u, std::max(epoch_size / 16,
                        epoch_size - epoch_unused_count));
    }